

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_30 [8];
  diff_match_patch_test dmp_test;
  char **argv_local;
  int argc_local;
  
  dmp_test._16_8_ = argv;
  diff_match_patch_test::diff_match_patch_test((diff_match_patch_test *)local_30);
  ResetOutputStream();
  wprintf(L"Starting diff_match_patch unit tests.");
  wprintf(L"\n");
  diff_match_patch_test::run_all_tests((diff_match_patch_test *)local_30);
  ResetOutputStream();
  wprintf(L"Done.");
  wprintf(L"\n");
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  diff_match_patch_test dmp_test;
  dmpDebug(L"Starting diff_match_patch unit tests.");
  dmp_test.run_all_tests();
  dmpDebug(L"Done.");
  return 0;
}